

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float text_base_offset;
  float line_height;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    fVar4 = ImMax<float>((pIVar1->DC).CurrentLineSize.y,in_RDI[1]);
    fVar5 = ImMax<float>((pIVar1->DC).CurrentLineTextBaseOffset,in_XMM0_Da);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(pIVar1->DC).CursorPos.x + *in_RDI,
                   (pIVar1->DC).CursorPos.y);
    IVar2.y = in_stack_ffffffffffffffd4;
    IVar2.x = in_stack_ffffffffffffffd0;
    (pIVar1->DC).CursorPosPrevLine = IVar2;
    (pIVar1->DC).CursorPos.x =
         (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + (pIVar1->DC).ColumnsOffset.x);
    (pIVar1->DC).CursorPos.y =
         (float)(int)((pIVar1->DC).CursorPos.y + fVar4 + (pIVar3->Style).ItemSpacing.y);
    fVar6 = ImMax<float>((pIVar1->DC).CursorMaxPos.x,(pIVar1->DC).CursorPosPrevLine.x);
    (pIVar1->DC).CursorMaxPos.x = fVar6;
    fVar6 = ImMax<float>((pIVar1->DC).CursorMaxPos.y,
                         (pIVar1->DC).CursorPos.y - (pIVar3->Style).ItemSpacing.y);
    (pIVar1->DC).CursorMaxPos.y = fVar6;
    (pIVar1->DC).PrevLineSize.y = fVar4;
    (pIVar1->DC).PrevLineTextBaseOffset = fVar5;
    (pIVar1->DC).CurrentLineTextBaseOffset = 0.0;
    (pIVar1->DC).CurrentLineSize.y = 0.0;
    if ((pIVar1->DC).LayoutType == 0) {
      SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrentLineSize.y, size.y);
    const float text_base_offset = ImMax(window->DC.CurrentLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine = ImVec2(window->DC.CursorPos.x + size.x, window->DC.CursorPos.y);
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrentLineSize.y = window->DC.CurrentLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}